

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O3

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *__dest;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  char *ptr [64];
  char *local_238 [65];
  
  __dest = (char *)operator_new__(0x2000);
  strncpy(__dest,__file,0x2000);
  local_238[0] = "open_jtalk";
  cVar5 = *__dest;
  if (cVar5 == '\0') {
    uVar2 = 1;
LAB_0014552b:
    iVar1 = open(this,(char *)(ulong)uVar2,(int)local_238,___oflag);
    operator_delete__(__dest);
    return iVar1;
  }
  uVar2 = 1;
  lVar3 = 1;
  pcVar4 = __dest;
  do {
    iVar1 = isspace((int)cVar5);
    if (iVar1 != 0) {
      do {
        *pcVar4 = '\0';
        cVar5 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
        iVar1 = isspace((int)cVar5);
      } while (iVar1 != 0);
      if (cVar5 == '\0') {
        uVar2 = (uint)lVar3;
        goto LAB_0014552b;
      }
    }
    local_238[lVar3] = pcVar4;
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x200) {
      uVar2 = 0x200;
      goto LAB_0014552b;
    }
    uVar2 = uVar2 + 1;
    cVar5 = *pcVar4;
    while( true ) {
      if (cVar5 == '\0') goto LAB_0014552b;
      iVar1 = isspace((int)cVar5);
      if (iVar1 != 0) break;
      cVar5 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    }
  } while( true );
}

Assistant:

bool Param::open(const char *arg, const Option *opts) {
  scoped_fixed_array<char, BUF_SIZE> str;
  std::strncpy(str.get(), arg, str.size());
  char* ptr[64];
  unsigned int size = 1;
  ptr[0] = const_cast<char*>(PACKAGE);

  for (char *p = str.get(); *p;) {
    while (isspace(*p)) *p++ = '\0';
    if (*p == '\0') break;
    ptr[size++] = p;
    if (size == sizeof(ptr)) break;
    while (*p && !isspace(*p)) p++;
  }

  return open(size, ptr, opts);
}